

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ip6-addr.c
# Opt level: O0

int run_test_ip6_addr_link_local(void)

{
  char *__s1;
  int iVar1;
  uv_loop_t *loop;
  undefined8 uVar2;
  int local_128;
  int r;
  int ix;
  int count;
  size_t interface_id_len;
  char interface_id [17];
  size_t scoped_addr_len;
  char scoped_addr [128];
  char *device_name;
  uint iface_index;
  sockaddr_in6 addr;
  uv_interface_address_t *address;
  uv_interface_address_t *addresses;
  char string_address [46];
  
  iVar1 = uv_interface_addresses(&address,&r);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ip6-addr.c"
            ,0x36,"0 == uv_interface_addresses(&addresses, &count)");
    abort();
  }
  local_128 = 0;
  do {
    if (r <= local_128) {
      uv_free_interface_addresses(address,r);
      stack0xffffffffffffff00 = 0x80;
      iVar1 = uv_if_indextoname(0xffffffff,&scoped_addr_len,interface_id + 0x10);
      if (iVar1 == 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ip6-addr.c"
                ,0x72,"0 != uv_if_indextoname((unsigned int)-1, scoped_addr, &scoped_addr_len)");
        abort();
      }
      loop = (uv_loop_t *)uv_default_loop();
      close_loop(loop);
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      if (iVar1 == 0) {
        return 0;
      }
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ip6-addr.c"
              ,0x74,"0 == uv_loop_close(uv_default_loop())");
      abort();
    }
    addr._20_8_ = address + local_128;
    if ((((uv_interface_address_t *)addr._20_8_)->address).address4.sin_family == 10) {
      iVar1 = uv_inet_ntop(10,(undefined1 *)
                              ((long)&((uv_interface_address_t *)addr._20_8_)->address + 8),
                           &addresses,0x2e);
      if (iVar1 != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ip6-addr.c"
                ,0x41,
                "0 == uv_inet_ntop(AF_INET6, &address->address.address6.sin6_addr, string_address, sizeof(string_address))"
               );
        abort();
      }
      iVar1 = strncmp((char *)&addresses,"fe80::",6);
      if (iVar1 == 0) {
        device_name._0_4_ = *(uint *)(addr._20_8_ + 0x2c);
        __s1 = *(char **)addr._20_8_;
        stack0xffffffffffffff00 = 0x80;
        iVar1 = uv_if_indextoname((uint)device_name,&scoped_addr_len,interface_id + 0x10);
        if (iVar1 != 0) {
          fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ip6-addr.c"
                  ,0x4b,"0 == uv_if_indextoname(iface_index, scoped_addr, &scoped_addr_len)");
          abort();
        }
        iVar1 = strcmp(__s1,(char *)&scoped_addr_len);
        if (iVar1 != 0) {
          fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ip6-addr.c"
                  ,0x4e,"0 == strcmp(device_name, scoped_addr)");
          abort();
        }
        _ix = 0x11;
        iVar1 = uv_if_indextoiid((uint)device_name,&interface_id_len,&ix);
        if (iVar1 != 0) {
          fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ip6-addr.c"
                  ,0x53,"0 == r");
          abort();
        }
        iVar1 = strcmp(__s1,(char *)&interface_id_len);
        if (iVar1 != 0) {
          fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ip6-addr.c"
                  ,0x59,"0 == strcmp(device_name, interface_id)");
          abort();
        }
        snprintf((char *)&scoped_addr_len,0x80,"%s%%%s",&addresses,&interface_id_len);
        fprintf(_stderr,"Testing link-local address %s (iface_index: 0x%02x, device_name: %s)\n",
                &scoped_addr_len,(ulong)(uint)device_name,__s1);
        fflush(_stderr);
        iVar1 = uv_ip6_addr(&scoped_addr_len,0x23a3,(long)&device_name + 4);
        if (iVar1 != 0) {
          fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ip6-addr.c"
                  ,0x69,"0 == uv_ip6_addr(scoped_addr, TEST_PORT, &addr)");
          abort();
        }
        fprintf(_stderr,"Got scope_id 0x%02x\n",(ulong)addr.sin6_addr.__in6_u.__u6_addr32[2]);
        fflush(_stderr);
        if ((uint)device_name != addr.sin6_addr.__in6_u.__u6_addr32[2]) {
          fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ip6-addr.c"
                  ,0x6c,"iface_index == addr.sin6_scope_id");
          abort();
        }
      }
    }
    local_128 = local_128 + 1;
  } while( true );
}

Assistant:

TEST_IMPL(ip6_addr_link_local) {
#if defined(__CYGWIN__) || defined(__MSYS__)
  /* FIXME: Does Cygwin support this?  */
  RETURN_SKIP("FIXME: This test needs more investigation on Cygwin");
#endif
  char string_address[INET6_ADDRSTRLEN];
  uv_interface_address_t* addresses;
  uv_interface_address_t* address;
  struct sockaddr_in6 addr;
  unsigned int iface_index;
  const char* device_name;
  /* 40 bytes address, 16 bytes device name, plus reserve. */
  char scoped_addr[128];
  size_t scoped_addr_len;
  char interface_id[UV_IF_NAMESIZE];
  size_t interface_id_len;
  int count;
  int ix;
  int r;

  ASSERT(0 == uv_interface_addresses(&addresses, &count));

  for (ix = 0; ix < count; ix++) {
    address = addresses + ix;

    if (address->address.address6.sin6_family != AF_INET6)
      continue;

    ASSERT(0 == uv_inet_ntop(AF_INET6,
                             &address->address.address6.sin6_addr,
                             string_address,
                             sizeof(string_address)));

    /* Skip addresses that are not link-local. */
    if (strncmp(string_address, "fe80::", 6) != 0)
      continue;

    iface_index = address->address.address6.sin6_scope_id;
    device_name = address->name;

    scoped_addr_len = sizeof(scoped_addr);
    ASSERT(0 == uv_if_indextoname(iface_index, scoped_addr, &scoped_addr_len));
#ifndef _WIN32
    /* This assert fails on Windows, as Windows semantics are different. */
    ASSERT(0 == strcmp(device_name, scoped_addr));
#endif

    interface_id_len = sizeof(interface_id);
    r = uv_if_indextoiid(iface_index, interface_id, &interface_id_len);
    ASSERT(0 == r);
#ifdef _WIN32
    /* On Windows, the interface identifier is the numeric string of the index. */
    ASSERT(strtoul(interface_id, NULL, 10) == iface_index);
#else
    /* On Unix/Linux, the interface identifier is the interface device name. */
    ASSERT(0 == strcmp(device_name, interface_id));
#endif

    snprintf(scoped_addr,
             sizeof(scoped_addr),
             "%s%%%s",
             string_address,
             interface_id);

    fprintf(stderr, "Testing link-local address %s "
            "(iface_index: 0x%02x, device_name: %s)\n",
            scoped_addr,
            iface_index,
            device_name);
    fflush(stderr);

    ASSERT(0 == uv_ip6_addr(scoped_addr, TEST_PORT, &addr));
    fprintf(stderr, "Got scope_id 0x%02x\n", addr.sin6_scope_id);
    fflush(stderr);
    ASSERT(iface_index == addr.sin6_scope_id);
  }

  uv_free_interface_addresses(addresses, count);

  scoped_addr_len = sizeof(scoped_addr);
  ASSERT(0 != uv_if_indextoname((unsigned int)-1, scoped_addr, &scoped_addr_len));

  MAKE_VALGRIND_HAPPY();
  return 0;
}